

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O1

String<char> * __thiscall Qentem::String<char>::operator=(String<char> *this,String<char> *src)

{
  uint size;
  char *from;
  char *to;
  
  if (this != src) {
    deallocate(this);
    from = src->storage_;
    size = src->length_;
    to = allocate(this,size + 1);
    Memory::Copy<unsigned_int>(to,from,size);
    to[size] = '\0';
    this->length_ = size;
  }
  return this;
}

Assistant:

String &operator=(const String &src) {
        if (this != &src) {
            deallocate();
            copyString(src.First(), src.Length());
        }

        return *this;
    }